

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

int match_tcp(void *data,packet_t *pkt)

{
  uint16_t uVar1;
  int iVar2;
  match_tcp_t *m;
  packet_t *pkt_local;
  void *data_local;
  
  if ((pkt->ip_proto == '\x06') && (pkt->tcp != (tcp_t *)0x0)) {
    uVar1 = ntohs(pkt->tcp->src);
    iVar2 = match_port(uVar1,(uint16_t *)data);
    if ((iVar2 == 0) == ((*(byte *)((long)data + 0xb) & 1) != 0)) {
      uVar1 = ntohs(pkt->tcp->dst);
      iVar2 = match_port(uVar1,(uint16_t *)((long)data + 4));
      if ((iVar2 == 0) == ((*(byte *)((long)data + 0xb) & 2) != 0)) {
        if (((pkt->tcp->flag & *(byte *)((long)data + 10)) != *(byte *)((long)data + 9)) ==
            ((*(byte *)((long)data + 0xb) & 8) != 0)) {
          data_local._4_4_ = 1;
        }
        else {
          data_local._4_4_ = 0;
        }
      }
      else {
        data_local._4_4_ = 0;
      }
    }
    else {
      data_local._4_4_ = 0;
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int match_tcp(void *data, packet_t *pkt)
{
	match_tcp_t *m = (match_tcp_t *)data;

	if (pkt->ip_proto != IPPROTO_TCP || pkt->tcp == NULL) {
		return 0;
	}

	if (INVF(m, INV_TCP_SRC, !match_port(ntohs(pkt->tcp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_TCP_DST, !match_port(ntohs(pkt->tcp->dst), m->dst))) {
		return 0;
	}

	if (INVF(m, INV_TCP_FLAG, !((pkt->tcp->flag & m->flag_mask) == m->flag))) {
		return 0;
	}

	return 1;
}